

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void i4_factor(int n,int maxfactor,int *nfactor,int *factor,int *power,int *nleft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint n_00;
  
  *nfactor = 0;
  if (0 < maxfactor) {
    memset(factor,0,(ulong)(uint)maxfactor << 2);
    memset(power,0,(ulong)(uint)maxfactor << 2);
  }
  *nleft = n;
  if (n != 0) {
    if ((n + 1U & 0xfffffffd) != 0) {
      n_00 = 1;
      do {
        iVar1 = prime(n_00);
        iVar3 = *nleft;
        iVar2 = -iVar3;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        if (iVar2 % iVar1 == 0) {
          iVar3 = *nfactor;
          if (iVar3 < maxfactor) {
            *nfactor = iVar3 + 1;
            factor[iVar3] = iVar1;
            do {
              power[(long)*nfactor + -1] = power[(long)*nfactor + -1] + 1;
              iVar2 = *nleft / iVar1;
              *nleft = iVar2;
              iVar3 = -iVar2;
              if (0 < iVar2) {
                iVar3 = iVar2;
              }
            } while (iVar3 % iVar1 == 0);
            if (iVar3 == 1) {
              return;
            }
          }
        }
        if (0x63f < n_00) {
          return;
        }
        n_00 = n_00 + 1;
      } while( true );
    }
    *nfactor = 1;
    *factor = 1;
    *power = 1;
  }
  return;
}

Assistant:

void i4_factor ( int n, int maxfactor, int &nfactor, int factor[], 
  int power[], int &nleft )

//****************************************************************************80
//
//  Purpose:
//
//    I4_FACTOR factors an integer into prime factors.
//
//  Discussion:
//
//    N = NLEFT * Product ( 1 <= I <= NFACTOR ) FACTOR(I)^POWER(I).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 February 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the integer to be factored.  N may be positive,
//    negative, or 0.
//
//    Input, int MAXFACTOR, the maximum number of prime factors for
//    which storage has been allocated.
//
//    Output, int &NFACTOR, the number of prime factors of N discovered
//    by the routine.
//
//    Output, int FACTOR[MAXFACTOR], the prime factors of N.
//
//    Output, int POWER[MAXFACTOR].  POWER(I) is the power of
//    the FACTOR(I) in the representation of N.
//
//    Output, int &NLEFT, the factor of N that the routine could not
//    divide out.  If NLEFT is 1, then N has been completely factored.
//    Otherwise, NLEFT represents factors of N involving large primes.
//
{
  int i;
  int maxprime;
  int p;

  nfactor = 0;

  for ( i = 0; i < maxfactor; i++ )
  {
    factor[i] = 0;
  }

  for ( i = 0; i < maxfactor; i++ )
  {
    power[i] = 0;
  }

  nleft = n;

  if ( n == 0 )
  {
    return;
  }

  if ( abs ( n ) == 1 )
  {
    nfactor = 1;
    factor[0] = 1;
    power[0] = 1;
    return;
  }
//
//  Find out how many primes we stored.
//
  maxprime = prime ( -1 );
//
//  Try dividing the remainder by each prime.
//
  for ( i = 1; i <= maxprime; i++ )
  {
    p = prime ( i );

    if ( abs ( nleft ) % p == 0 )
    {
      if ( nfactor < maxfactor )
      {
        nfactor = nfactor + 1;
        factor[nfactor-1] = p;

        for ( ; ; )
        {
          power[nfactor-1] = power[nfactor-1] + 1;
          nleft = nleft / p;

          if ( abs ( nleft ) % p != 0 )
          {
            break;
          }

        }

        if ( abs ( nleft ) == 1 )
        {
          break;
        }
      }
    }
  }

  return;
}